

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

int Of_ManComputeForwardDirconObj(Of_Man_t *p,int iObj)

{
  Of_Obj_t *pOVar1;
  int *pCutSet;
  int iVar2;
  int iVar3;
  ulong uVar4;
  uint *pCut;
  uint *pCut_00;
  uint *pCut_01;
  int iVar5;
  int Delay2This;
  int Delay1This;
  int local_40;
  int local_3c;
  int *local_38;
  
  uVar4 = (ulong)(uint)iObj;
  local_38 = Of_ObjCutSet(p,iObj);
  pCut_01 = (uint *)(local_38 + 1);
  iVar2 = 1000000000;
  pCut_00 = (uint *)0x0;
  pCut = (uint *)0x0;
  iVar5 = 1000000000;
  for (iVar3 = 0; pCutSet = local_38, iVar3 < *local_38; iVar3 = iVar3 + 1) {
    Of_ManComputeForwardDirconCut(p,(int)uVar4,(int *)pCut_01,&local_3c,&local_40);
    if (local_3c < iVar5) {
      pCut_00 = pCut_01;
    }
    if (local_3c <= iVar5) {
      iVar5 = local_3c;
    }
    if (local_40 < iVar2) {
      pCut = pCut_01;
    }
    if (local_40 <= iVar2) {
      iVar2 = local_40;
    }
    pCut_01 = pCut_01 + (ulong)(*pCut_01 & 0x1f) + 4;
  }
  pOVar1 = p->pObjs;
  pOVar1[iObj].Delay1 = iVar5;
  pOVar1[iObj].Delay2 = iVar2;
  Of_ObjSetCutBestP(p,local_38,iObj,(int *)pCut_00);
  iVar2 = Vec_IntEntry(&p->vCutSets,iObj);
  iVar3 = Of_CutHandle(pCutSet,(int *)pCut);
  p->pObjs[iObj].iCutH2 = iVar3 + iVar2;
  return iVar5;
}

Assistant:

int Of_ManComputeForwardDirconObj( Of_Man_t * p, int iObj )
{
    int Delay1 = ABC_INFINITY, Delay2 = ABC_INFINITY;
    int i, * pCut, * pCutMin = NULL, * pCutMin2 = NULL, * pList = Of_ObjCutSet(p, iObj);
    Of_SetForEachCut( pList, pCut, i )
    {
        int Delay1This, Delay2This;
        Of_ManComputeForwardDirconCut( p, iObj, pCut, &Delay1This, &Delay2This );
        if ( Delay1 > Delay1This )
            pCutMin = pCut;
        if ( Delay2 > Delay2This )
            pCutMin2 = pCut;
        Delay1 = Abc_MinInt( Delay1, Delay1This );
        Delay2 = Abc_MinInt( Delay2, Delay2This );
    }
    Of_ObjSetDelay1( p, iObj, Delay1 );
    Of_ObjSetDelay2( p, iObj, Delay2 );
    Of_ObjSetCutBestP( p, pList, iObj, pCutMin );
    Of_ObjSetCutBestP2( p, pList, iObj, pCutMin2 );
    return Delay1;
}